

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

real_t __thiscall
xLearn::Trainer::calc_gradient
          (Trainer *this,vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *reader)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  size_type sVar5;
  reference ppRVar6;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_RSI;
  long in_RDI;
  real_t rVar7;
  index_t tmp;
  DMatrix *matrix;
  int i;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_ffffffffffffff00;
  allocator *function;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined1 local_80 [4];
  LogSeverity severity;
  int local_78;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [36];
  Logger local_14;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                    (in_stack_ffffffffffffff00);
  if (bVar1) {
    Logger::Logger(&local_14,ERR);
    severity = (LogSeverity)((ulong)_local_80 >> 0x20);
    iVar2 = (int)((ulong)in_RDI >> 0x20);
    function = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.cc"
               ,function);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"calc_gradient",&local_71);
    poVar3 = Logger::Start(severity,(string *)
                                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                           iVar2,(string *)function);
    poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/trainer.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xfc);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"reader.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar1 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::empty
                      (in_stack_ffffffffffffff00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar1);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"true");
    poVar3 = std::operator<<(poVar3," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar3,true);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x38))();
  local_78 = 0;
  while( true ) {
    sVar5 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::size(local_10);
    if (sVar5 <= (ulong)(long)local_78) break;
    ppRVar6 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                        (local_10,(long)local_78);
    (*(*ppRVar6)->_vptr_Reader[5])();
    _local_80 = 0;
    while( true ) {
      ppRVar6 = std::vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_>::operator[]
                          (local_10,(long)local_78);
      iVar2 = (*(*ppRVar6)->_vptr_Reader[4])(*ppRVar6,local_80);
      if (iVar2 == 0) break;
      (**(code **)(**(long **)(in_RDI + 0x30) + 0x20))
                (*(long **)(in_RDI + 0x30),_local_80,*(undefined8 *)(in_RDI + 0x28));
    }
    local_78 = local_78 + 1;
  }
  rVar7 = (real_t)(**(code **)(**(long **)(in_RDI + 0x30) + 0x30))();
  return rVar7;
}

Assistant:

real_t Trainer::calc_gradient(std::vector<Reader*>& reader) {
  CHECK_NE(reader.empty(), true);
  loss_->Reset();
  for (int i = 0; i < reader.size(); ++i) {
    reader[i]->Reset();
    DMatrix* matrix = nullptr;
    for (;;) {
      index_t tmp = reader[i]->Samples(matrix);
      if (tmp == 0) { break; }
      loss_->CalcGrad(matrix, *model_);
    }
  }
  return loss_->GetLoss();
}